

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall duckdb::DBConfig::SetDefaultTempDirectory(DBConfig *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->options).use_temporary_directory == false) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    ::std::__cxx11::string::operator=
              ((string *)&(this->options).temporary_directory,(string *)&local_38);
  }
  else {
    bVar1 = IsInMemoryDatabase((this->options).database_path._M_dataplus._M_p);
    if (bVar1) {
      ::std::__cxx11::string::assign((char *)&(this->options).temporary_directory);
      return;
    }
    ::std::operator+(&local_38,&(this->options).database_path,".tmp");
    ::std::__cxx11::string::operator=
              ((string *)&(this->options).temporary_directory,(string *)&local_38);
  }
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void DBConfig::SetDefaultTempDirectory() {
	if (!options.use_temporary_directory) {
		options.temporary_directory = string();
	} else if (DBConfig::IsInMemoryDatabase(options.database_path.c_str())) {
		options.temporary_directory = ".tmp";
	} else {
		options.temporary_directory = options.database_path + ".tmp";
	}
}